

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void rshift256(uint16_t *out,uint16_t *a,int n,int sign_extend)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  if (sign_extend == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(a[0xf] >> 0xf);
  }
  iVar4 = n + 0xf0;
  lVar5 = 0xf;
  do {
    uVar6 = 0;
    iVar3 = 0;
    do {
      uVar1 = iVar4 + iVar3;
      uVar7 = uVar2;
      if ((int)uVar1 < 0x100) {
        uVar7 = (uint)((a[(int)uVar1 >> 4] >> (uVar1 & 0xf) & 1) != 0);
      }
      uVar6 = uVar6 | uVar7 << ((byte)iVar3 & 0x1f);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x10);
    out[lVar5] = (uint16_t)uVar6;
    iVar4 = iVar4 + -0x10;
    bVar8 = lVar5 != 0;
    lVar5 = lVar5 + -1;
  } while (bVar8);
  return;
}

Assistant:

static void rshift256(uint16_t* out, const uint16_t* a, int n, int sign_extend) {
    uint16_t sign = sign_extend && (a[15] >> 15);
    int i, j;
    for (i = 15; i >= 0; --i) {
        uint16_t v = 0;
        for (j = 0; j < 16; ++j) {
            int frompos = i*16 + j + n;
            if (frompos >= 256) {
                v |= sign << j;
            } else {
                v |= ((uint16_t)((a[frompos >> 4] >> (frompos & 15)) & 1)) << j;
            }
        }
        out[i] = v;
    }
}